

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void reallymarkobject(global_State *g,GCObject *o)

{
  long *plVar1;
  Udata *iu;
  TValue *io;
  TValue uvalue;
  GCObject *o_local;
  global_State *g_local;
  
  uvalue._8_8_ = o;
LAB_0010e830:
  *(byte *)(uvalue._8_8_ + 9) = *(byte *)(uvalue._8_8_ + 9) & 0xfc;
  switch(*(undefined1 *)(uvalue._8_8_ + 8)) {
  case 4:
    *(byte *)(uvalue._8_8_ + 9) = *(byte *)(uvalue._8_8_ + 9) | 4;
    g->GCmemtrav = (long)(int)(*(byte *)(uvalue._8_8_ + 0xb) + 1) + 0x18 + g->GCmemtrav;
    return;
  case 5:
    *(GCObject **)(uvalue._8_8_ + 0x30) = g->gray;
    g->gray = (GCObject *)uvalue._8_8_;
    return;
  case 6:
    *(GCObject **)(uvalue._8_8_ + 0x10) = g->gray;
    g->gray = (GCObject *)uvalue._8_8_;
    return;
  case 7:
    break;
  case 8:
    *(GCObject **)(uvalue._8_8_ + 0x48) = g->gray;
    g->gray = (GCObject *)uvalue._8_8_;
    return;
  case 9:
    *(GCObject **)(uvalue._8_8_ + 0x70) = g->gray;
    g->gray = (GCObject *)uvalue._8_8_;
    return;
  default:
    return;
  case 0x14:
    *(byte *)(uvalue._8_8_ + 9) = *(byte *)(uvalue._8_8_ + 9) | 4;
    g->GCmemtrav = *(long *)(uvalue._8_8_ + 0x10) + 0x19 + g->GCmemtrav;
    return;
  case 0x26:
    *(GCObject **)(uvalue._8_8_ + 0x10) = g->gray;
    g->gray = (GCObject *)uvalue._8_8_;
    return;
  }
  if ((*(long *)(uvalue._8_8_ + 0x10) != 0) &&
     ((*(byte *)(*(long *)(uvalue._8_8_ + 0x10) + 9) & 3) != 0)) {
    reallymarkobject(g,*(GCObject **)(uvalue._8_8_ + 0x10));
  }
  *(byte *)(uvalue._8_8_ + 9) = *(byte *)(uvalue._8_8_ + 9) | 4;
  g->GCmemtrav = *(long *)(uvalue._8_8_ + 0x18) + 0x28 + g->GCmemtrav;
  plVar1 = (long *)(uvalue._8_8_ + 0x20);
  if ((*(byte *)(uvalue._8_8_ + 10) & 0x40) == 0) {
    return;
  }
  uvalue._8_8_ = *plVar1;
  if ((*(byte *)(*plVar1 + 9) & 3) == 0) {
    return;
  }
  goto LAB_0010e830;
}

Assistant:

static void reallymarkobject (global_State *g, GCObject *o) {
 reentry:
  white2gray(o);
  switch (o->tt) {
    case LUA_TSHRSTR: {
      gray2black(o);
      g->GCmemtrav += sizelstring(gco2ts(o)->shrlen);
      break;
    }
    case LUA_TLNGSTR: {
      gray2black(o);
      g->GCmemtrav += sizelstring(gco2ts(o)->u.lnglen);
      break;
    }
    case LUA_TUSERDATA: {
      TValue uvalue;
      markobjectN(g, gco2u(o)->metatable);  /* mark its metatable */
      gray2black(o);
      g->GCmemtrav += sizeudata(gco2u(o));
      getuservalue(g->mainthread, gco2u(o), &uvalue);
      if (valiswhite(&uvalue)) {  /* markvalue(g, &uvalue); */
        o = gcvalue(&uvalue);
        goto reentry;
      }
      break;
    }
    case LUA_TLCL: {
      linkgclist(gco2lcl(o), g->gray);
      break;
    }
    case LUA_TCCL: {
      linkgclist(gco2ccl(o), g->gray);
      break;
    }
    case LUA_TTABLE: {
      linkgclist(gco2t(o), g->gray);
      break;
    }
    case LUA_TTHREAD: {
      linkgclist(gco2th(o), g->gray);
      break;
    }
    case LUA_TPROTO: {
      linkgclist(gco2p(o), g->gray);
      break;
    }
    default: lua_assert(0); break;
  }
}